

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiMultiSelectState * __thiscall
ImPool<ImGuiMultiSelectState>::Add(ImPool<ImGuiMultiSelectState> *this)

{
  ImGuiMultiSelectState *pIVar1;
  ImGuiSelectionUserData *pIVar2;
  int iVar3;
  int iVar4;
  ImGuiMultiSelectState *pIVar5;
  
  iVar3 = this->FreeIdx;
  if (iVar3 == (this->Buf).Size) {
    ImVector<ImGuiMultiSelectState>::resize(&this->Buf,iVar3 + 1);
    iVar4 = this->FreeIdx + 1;
    pIVar5 = (this->Buf).Data;
  }
  else {
    pIVar5 = (this->Buf).Data;
    iVar4 = *(int *)&pIVar5[iVar3].Window;
  }
  this->FreeIdx = iVar4;
  pIVar1 = pIVar5 + iVar3;
  pIVar1->Window = (ImGuiWindow *)0x0;
  pIVar1->ID = 0;
  pIVar1->LastFrameActive = 0;
  pIVar5[iVar3].LastSelectionSize = 0;
  pIVar5[iVar3].RangeSelected = -1;
  pIVar5[iVar3].NavIdSelected = -1;
  pIVar2 = &pIVar5[iVar3].RangeSrcItem;
  *(undefined4 *)pIVar2 = 0xffffffff;
  *(undefined4 *)((long)pIVar2 + 4) = 0xffffffff;
  *(undefined4 *)(pIVar2 + 1) = 0xffffffff;
  *(undefined4 *)((long)pIVar2 + 0xc) = 0xffffffff;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar3;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }